

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlockSymbols.cpp
# Opt level: O0

StatementBlockSymbol *
slang::ast::StatementBlockSymbol::fromSyntax(Scope *scope,ForLoopStatementSyntax *syntax)

{
  ForLoopStatementSyntax *scope_00;
  ForLoopStatementSyntax *this;
  bool bVar1;
  Compilation *compilation;
  SeparatedSyntaxList<slang::syntax::SyntaxNode> *this_00;
  SyntaxNode *this_01;
  ForVariableDeclarationSyntax *syntax_00;
  StatementSyntax *syntax_01;
  span<const_slang::ast::StatementBlockSymbol_*const,_18446744073709551615UL> sVar2;
  string_view name_00;
  _Optional_payload_base<slang::ast::VariableLifetime> in_stack_ffffffffffffff10;
  Scope *scope_01;
  pointer local_c8;
  size_type local_c0;
  VariableSymbol *var;
  SyntaxNode *init;
  const_iterator __end2;
  const_iterator __begin2;
  SeparatedSyntaxList<slang::syntax::SyntaxNode> *__range2;
  VariableSymbol *lastVar;
  Compilation *comp;
  char *local_68;
  type local_60;
  type local_58;
  StatementBlockSymbol *local_50;
  StatementBlockSymbol *result;
  type *loc;
  type *name;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::SourceLocation> local_30;
  ForLoopStatementSyntax *local_18;
  ForLoopStatementSyntax *syntax_local;
  Scope *scope_local;
  
  local_18 = syntax;
  syntax_local = (ForLoopStatementSyntax *)scope;
  name = (type *)parsing::Token::location(&syntax->forKeyword);
  getLabel(&local_30,&syntax->super_StatementSyntax,(SourceLocation)name);
  loc = (type *)std::
                get<0ul,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation>
                          (&local_30);
  result = (StatementBlockSymbol *)
           std::get<1ul,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation>
                     (&local_30);
  this = syntax_local;
  scope_00 = local_18;
  local_60 = *loc;
  local_58 = loc[1];
  local_68 = *(char **)&result->super_Symbol;
  std::optional<slang::ast::VariableLifetime>::optional
            ((optional<slang::ast::VariableLifetime> *)&comp);
  name_00._M_str = local_68;
  name_00._M_len = (size_t)local_58;
  local_50 = createBlock((ast *)this,(Scope *)scope_00,(StatementSyntax *)local_60,name_00,
                         (SourceLocation)0x0,(StatementBlockKind)comp,
                         (optional<slang::ast::VariableLifetime>)in_stack_ffffffffffffff10);
  compilation = Scope::getCompilation((Scope *)syntax_local);
  __range2 = (SeparatedSyntaxList<slang::syntax::SyntaxNode> *)0x0;
  this_00 = &local_18->initializers;
  join_0x00000010_0x00000000_ =
       slang::syntax::SeparatedSyntaxList<slang::syntax::SyntaxNode>::begin(this_00);
  _init = slang::syntax::SeparatedSyntaxList<slang::syntax::SyntaxNode>::end(this_00);
  while( true ) {
    bVar1 = iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::SyntaxNode>::iterator_base<const_slang::syntax::SyntaxNode_*>,_std::random_access_iterator_tag,_const_slang::syntax::SyntaxNode_*,_unsigned_long,_const_slang::syntax::SyntaxNode_**,_const_slang::syntax::SyntaxNode_*&>
            ::operator!=((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::SyntaxNode>::iterator_base<const_slang::syntax::SyntaxNode_*>,_std::random_access_iterator_tag,_const_slang::syntax::SyntaxNode_*,_unsigned_long,_const_slang::syntax::SyntaxNode_**,_const_slang::syntax::SyntaxNode_*&>
                          *)&__end2.index,(iterator_base<const_slang::syntax::SyntaxNode_*> *)&init)
    ;
    if (!bVar1) break;
    this_01 = slang::syntax::SeparatedSyntaxList<slang::syntax::SyntaxNode>::
              iterator_base<const_slang::syntax::SyntaxNode_*>::operator*
                        ((iterator_base<const_slang::syntax::SyntaxNode_*> *)&__end2.index);
    syntax_00 = slang::syntax::SyntaxNode::as<slang::syntax::ForVariableDeclarationSyntax>(this_01);
    __range2 = (SeparatedSyntaxList<slang::syntax::SyntaxNode> *)
               VariableSymbol::fromSyntax(compilation,syntax_00,(VariableSymbol *)__range2);
    Scope::addMember(&local_50->super_Scope,(Symbol *)__range2);
    iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::SyntaxNode>::iterator_base<const_slang::syntax::SyntaxNode_*>,_std::random_access_iterator_tag,_const_slang::syntax::SyntaxNode_*,_unsigned_long,_const_slang::syntax::SyntaxNode_**,_const_slang::syntax::SyntaxNode_*&>
    ::operator++((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::SyntaxNode>::iterator_base<const_slang::syntax::SyntaxNode_*>,_std::random_access_iterator_tag,_const_slang::syntax::SyntaxNode_*,_unsigned_long,_const_slang::syntax::SyntaxNode_**,_const_slang::syntax::SyntaxNode_*&>
                  *)&__end2.index);
  }
  scope_01 = &local_50->super_Scope;
  syntax_01 = not_null<slang::syntax::StatementSyntax_*>::operator*(&local_18->statement);
  sVar2 = Statement::createAndAddBlockItems(scope_01,syntax_01,false);
  local_c8 = sVar2.data_;
  (local_50->blocks).data_ = local_c8;
  local_c0 = sVar2.size_;
  (local_50->blocks).size_ = local_c0;
  return local_50;
}

Assistant:

StatementBlockSymbol& StatementBlockSymbol::fromSyntax(const Scope& scope,
                                                       const ForLoopStatementSyntax& syntax) {
    auto [name, loc] = getLabel(syntax, syntax.forKeyword.location());
    auto result = createBlock(scope, syntax, name, loc);

    // If one entry is a variable declaration, they must all be.
    // We'll only enter this function if we have variable decls.
    auto& comp = scope.getCompilation();
    const VariableSymbol* lastVar = nullptr;
    for (auto init : syntax.initializers) {
        auto& var = VariableSymbol::fromSyntax(comp, init->as<ForVariableDeclarationSyntax>(),
                                               lastVar);

        lastVar = &var;
        result->addMember(var);
    }

    result->blocks = Statement::createAndAddBlockItems(*result, *syntax.statement,
                                                       /* labelHandled */ false);
    return *result;
}